

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double calculate_active_area(FRAME_INFO *frame_info,FIRSTPASS_STATS *this_frame)

{
  long in_RSI;
  long in_RDI;
  double dVar1;
  double active_pct;
  
  dVar1 = fclamp(1.0 - (*(double *)(in_RSI + 0x50) / 2.0 +
                       (*(double *)(in_RSI + 0x58) * 2.0) / (double)*(int *)(in_RDI + 0x10)),0.5,1.0
                );
  return dVar1;
}

Assistant:

static double calculate_active_area(const FRAME_INFO *frame_info,
                                    const FIRSTPASS_STATS *this_frame) {
  const double active_pct =
      1.0 -
      ((this_frame->intra_skip_pct / 2) +
       ((this_frame->inactive_zone_rows * 2) / (double)frame_info->mb_rows));
  return fclamp(active_pct, MIN_ACTIVE_AREA, MAX_ACTIVE_AREA);
}